

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)2>
          (Data *this,uint16 op,ByteCodeWriter *writer)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  uint16 local_2a [2];
  byte exop;
  byte byteop;
  byte exop_1;
  uint16 op_local;
  
  uVar1 = this->currentOffset;
  local_2a[0] = op;
  if (op < 0x100) {
    local_2d = 4;
    Write(this,&local_2d,1);
    local_2c = (undefined1)op;
    Write(this,&local_2c,1);
    iVar4 = 2;
  }
  else {
    local_2b = 5;
    Write(this,&local_2b,1);
    Write(this,local_2a,2);
    iVar4 = 3 - (uint)(local_2a[0] < 0x100);
  }
  if (iVar4 != this->currentOffset - uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd44,
                                "(OpCodeUtil::EncodedSize((Js::OpCode)op, layoutSize) == (currentOffset - offset))"
                                ,
                                "OpCodeUtil::EncodedSize((Js::OpCode)op, layoutSize) == (currentOffset - offset)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Data::EncodeOpCode(uint16 op, ByteCodeWriter* writer)
    {
        CompileAssert(layoutSize != SmallLayout);
        DebugOnly(const uint offset = currentOffset);

        if (op <= (uint16)Js::OpCode::MaxByteSizedOpcodes)
        {
            const byte exop = (byte)(layoutSize == LargeLayout ? Js::OpCode::LargeLayoutPrefix : Js::OpCode::MediumLayoutPrefix);
            Write(&exop, sizeof(byte));
            byte byteop = (byte)op;
            Write(&byteop, sizeof(byte));
        }
        else
        {
            const byte exop = (byte)(layoutSize == LargeLayout ? Js::OpCode::ExtendedLargeLayoutPrefix : Js::OpCode::ExtendedMediumLayoutPrefix);
            Write(&exop, sizeof(byte));
            Write(&op, sizeof(uint16));
        }
        Assert(OpCodeUtil::EncodedSize((Js::OpCode)op, layoutSize) == (currentOffset - offset));
    }